

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::FastFieldValuePrinterUtf8Escaping::PrintString
          (FastFieldValuePrinterUtf8Escaping *this,string *val,BaseTextGenerator *generator)

{
  BaseTextGenerator *this_00;
  string local_40;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  string *val_local;
  FastFieldValuePrinterUtf8Escaping *this_local;
  
  local_20 = generator;
  generator_local = (BaseTextGenerator *)val;
  val_local = (string *)this;
  BaseTextGenerator::PrintLiteral<2ul>(generator,(char (*) [2])0x7703cf);
  this_00 = local_20;
  strings::Utf8SafeCEscape(&local_40,(string *)generator_local);
  BaseTextGenerator::PrintString(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  BaseTextGenerator::PrintLiteral<2ul>(local_20,(char (*) [2])0x7703cf);
  return;
}

Assistant:

void PrintString(const std::string& val,
                   TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintLiteral("\"");
    generator->PrintString(strings::Utf8SafeCEscape(val));
    generator->PrintLiteral("\"");
  }